

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcBinaryStream.h
# Opt level: O2

unsigned_long __thiscall
o3dgc::BinaryStream::ReadUInt32ASCII(BinaryStream *this,unsigned_long *position)

{
  ulong uVar1;
  unsigned_long uVar2;
  long lVar3;
  
  if (*position < (this->m_stream).m_size - 5) {
    uVar2 = 0;
    uVar1 = *position;
    for (lVar3 = 0; lVar3 != 0x23; lVar3 = lVar3 + 7) {
      *position = uVar1 + 1;
      uVar2 = uVar2 + (long)(int)((uint)(this->m_stream).m_buffer[uVar1] << ((byte)lVar3 & 0x1f));
      uVar1 = uVar1 + 1;
    }
    return uVar2;
  }
  __assert_fail("position < m_stream.GetSize() - O3DGC_BINARY_STREAM_NUM_SYMBOLS_UINT32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcBinaryStream.h"
                ,0x145,"unsigned long o3dgc::BinaryStream::ReadUInt32ASCII(unsigned long &) const");
}

Assistant:

unsigned long           ReadUInt32ASCII(unsigned long & position)  const
                                {
                                    assert(position < m_stream.GetSize() - O3DGC_BINARY_STREAM_NUM_SYMBOLS_UINT32);
                                    unsigned long value = 0;
                                    unsigned long shift = 0;
                                    for(unsigned long i = 0; i < O3DGC_BINARY_STREAM_NUM_SYMBOLS_UINT32; ++i)
                                    {
                                        value  += (m_stream[position++] << shift);
                                        shift  += O3DGC_BINARY_STREAM_BITS_PER_SYMBOL0;
                                    }
                                    return value;
                                }